

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonObjectStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 N;
  JsonString *p;
  uchar *zIn;
  u32 n;
  char *z;
  JsonString *pStr;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  p = (JsonString *)sqlite3_aggregate_context(ctx,0x88);
  if (p != (JsonString *)0x0) {
    if (p->zBuf == (char *)0x0) {
      jsonInit(p,ctx);
      jsonAppendChar(p,'{');
    }
    else if (1 < p->nUsed) {
      jsonAppendChar(p,',');
    }
    p->pCtx = ctx;
    zIn = sqlite3_value_text(*argv);
    N = sqlite3_value_bytes(*argv);
    jsonAppendString(p,(char *)zIn,N);
    jsonAppendChar(p,':');
    jsonAppendValue(p,argv[1]);
  }
  return;
}

Assistant:

static void jsonObjectStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  const char *z;
  u32 n;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonInit(pStr, ctx);
      jsonAppendChar(pStr, '{');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    z = (const char*)sqlite3_value_text(argv[0]);
    n = (u32)sqlite3_value_bytes(argv[0]);
    jsonAppendString(pStr, z, n);
    jsonAppendChar(pStr, ':');
    jsonAppendValue(pStr, argv[1]);
  }
}